

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProductEvaluators.h
# Opt level: O3

void Eigen::internal::
     generic_product_impl<Eigen::Transpose<Eigen::Matrix<double,-1,-1,0,-1,-1>>,Eigen::Transpose<Eigen::Matrix<double,-1,-1,0,-1,-1>>,Eigen::DenseShape,Eigen::DenseShape,3>
     ::evalTo<Eigen::Matrix<double,_1,_1,0,_1,_1>>
               (Matrix<double,__1,__1,_0,__1,__1> *dst,
               Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *lhs,
               Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *rhs)

{
  ulong rows;
  undefined1 auVar1 [16];
  LhsNested LVar2;
  ulong uVar3;
  undefined8 *puVar4;
  ulong uVar5;
  double *pdVar6;
  Index col;
  long col_00;
  Index row;
  long row_00;
  ulong cols;
  CoeffReturnType CVar7;
  Product<Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_1>
  local_78;
  double *local_60;
  variable_if_dynamic<long,__1> local_58;
  double *local_48;
  variable_if_dynamic<long,__1> local_40;
  Index local_38;
  
  local_78 = MatrixBase<Eigen::Transpose<Eigen::Matrix<double,-1,-1,0,-1,-1>>>::
             lazyProduct<Eigen::Transpose<Eigen::Matrix<double,_1,_1,0,_1,_1>>>
                       ((MatrixBase<Eigen::Transpose<Eigen::Matrix<double,_1,_1,0,_1,_1>>> *)lhs,
                        (MatrixBase<Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_> *)
                        rhs);
  LVar2 = local_78.m_lhs.m_matrix;
  local_60 = ((LVar2.m_matrix)->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
             m_storage.m_data;
  local_58.m_value =
       ((LVar2.m_matrix)->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
       m_storage.m_rows;
  local_48 = ((local_78.m_rhs.m_matrix.m_matrix)->
             super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_data;
  cols = ((local_78.m_rhs.m_matrix.m_matrix)->
         super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_rows;
  rows = ((LVar2.m_matrix)->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
         m_storage.m_cols;
  local_40.m_value = cols;
  local_38 = local_58.m_value;
  if (((dst->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_rows !=
       rows) ||
     (uVar3 = cols, uVar5 = rows,
     (dst->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_cols !=
     cols)) {
    if ((long)(rows | cols) < 0) {
      __assert_fail("(!(RowsAtCompileTime!=Dynamic) || (rows==RowsAtCompileTime)) && (!(ColsAtCompileTime!=Dynamic) || (cols==ColsAtCompileTime)) && (!(RowsAtCompileTime==Dynamic && MaxRowsAtCompileTime!=Dynamic) || (rows<=MaxRowsAtCompileTime)) && (!(ColsAtCompileTime==Dynamic && MaxColsAtCompileTime!=Dynamic) || (cols<=MaxColsAtCompileTime)) && rows>=0 && cols>=0 && \"Invalid sizes when resizing a matrix or array.\""
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/haukri[P]MasterProject/Eigen/src/Core/PlainObjectBase.h"
                    ,0x11d,
                    "void Eigen::PlainObjectBase<Eigen::Matrix<double, -1, -1>>::resize(Index, Index) [Derived = Eigen::Matrix<double, -1, -1>]"
                   );
    }
    if ((cols != 0 && rows != 0) &&
       (auVar1 = ZEXT816(0) << 0x40 | ZEXT816(0x7fffffffffffffff),
       SUB168(auVar1 / SEXT816((long)cols),0) < (long)rows)) {
      puVar4 = (undefined8 *)
               __cxa_allocate_exception(8,local_48,SUB168(auVar1 % SEXT816((long)cols),0));
      *puVar4 = operator_new;
      __cxa_throw(puVar4,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
    }
    DenseStorage<double,_-1,_-1,_-1,_0>::resize
              ((DenseStorage<double,__1,__1,__1,_0> *)dst,rows * cols,rows,cols);
    uVar5 = (dst->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_rows
    ;
    uVar3 = (dst->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_cols
    ;
  }
  if ((uVar5 == rows) && (uVar3 == cols)) {
    if (0 < (long)cols) {
      pdVar6 = (dst->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
               m_data;
      col_00 = 0;
      uVar5 = rows;
      do {
        if (0 < (long)uVar5) {
          row_00 = 0;
          do {
            CVar7 = product_evaluator<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>,_Eigen::Transpose<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>,_1>,_8,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
                    ::coeff((product_evaluator<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_1>,_8,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
                             *)&local_78,row_00,col_00);
            pdVar6[row_00] = CVar7;
            row_00 = row_00 + 1;
            uVar5 = (dst->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
                    m_storage.m_rows;
          } while (row_00 < (long)uVar5);
          cols = (dst->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
                 m_cols;
        }
        col_00 = col_00 + 1;
        pdVar6 = pdVar6 + rows;
      } while (col_00 < (long)cols);
    }
    return;
  }
  __assert_fail("dst.rows() == dstRows && dst.cols() == dstCols",
                "/workspace/llm4binary/github/license_all_cmakelists_25/haukri[P]MasterProject/Eigen/src/Core/AssignEvaluator.h"
                ,0x2d1,
                "void Eigen::internal::resize_if_allowed(DstXprType &, const SrcXprType &, const internal::assign_op<T1, T2> &) [DstXprType = Eigen::Matrix<double, -1, -1>, SrcXprType = Eigen::Product<Eigen::Transpose<Eigen::Matrix<double, -1, -1>>, Eigen::Transpose<Eigen::Matrix<double, -1, -1>>, 1>, T1 = double, T2 = double]"
               );
}

Assistant:

static EIGEN_STRONG_INLINE void evalTo(Dst& dst, const Lhs& lhs, const Rhs& rhs)
  {
    // Same as: dst.noalias() = lhs.lazyProduct(rhs);
    // but easier on the compiler side
    call_assignment_no_alias(dst, lhs.lazyProduct(rhs), internal::assign_op<typename Dst::Scalar,Scalar>());
  }